

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool *bufPool)

{
  int iVar1;
  pthread_mutex_t *in_RDI;
  size_t totalBufferSize;
  uint u;
  size_t poolSize;
  long local_20;
  uint local_14;
  
  iVar1 = *(int *)((long)in_RDI + 0x30);
  local_20 = 0;
  pthread_mutex_lock(in_RDI);
  for (local_14 = 0; local_14 < *(uint *)((long)in_RDI + 0x30); local_14 = local_14 + 1) {
    local_20 = *(long *)((long)in_RDI + (ulong)local_14 * 0x10 + 0x58) + local_20;
  }
  pthread_mutex_unlock(in_RDI);
  return (ulong)(iVar1 - 1) * 0x10 + 0x60 + local_20;
}

Assistant:

static size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool* bufPool)
{
    size_t const poolSize = sizeof(*bufPool)
                          + (bufPool->totalBuffers - 1) * sizeof(buffer_t);
    unsigned u;
    size_t totalBufferSize = 0;
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    for (u=0; u<bufPool->totalBuffers; u++)
        totalBufferSize += bufPool->bTable[u].capacity;
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);

    return poolSize + totalBufferSize;
}